

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void __thiscall
NodeParser::parseDemand
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  int iVar1;
  size_type sVar2;
  undefined1 local_48 [8];
  Demand d;
  Junction *junc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  Network *nw_local;
  Node *node_local;
  NodeParser *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokens);
  if ((1 < sVar2) && (iVar1 = (*(node->super_Element)._vptr_Element[2])(), iVar1 == 0)) {
    d.timePattern = (Pattern *)node;
    Demand::Demand((Demand *)local_48);
    parseDemandData((Demand *)local_48,nw,tokens);
    std::__cxx11::list<Demand,_std::allocator<Demand>_>::push_back
              ((list<Demand,_std::allocator<Demand>_> *)&d.timePattern[2].super_Element.name,
               (value_type *)local_48);
    Demand::~Demand((Demand *)local_48);
  }
  return;
}

Assistant:

void NodeParser::parseDemand(Node* node, Network* nw, vector<string>& tokens)
{
    // ... cast Node to Junction
    if ( tokens.size() < 2 ) return;
    if ( node->type() != Node::JUNCTION ) return;
    Junction* junc = static_cast<Junction*>(node);

    // ... declare a demand object and read its parameters
    Demand d;
    parseDemandData(d, nw, tokens);

    // ... add demand to junction
    //     (demand d passed by value so a copy is being added to demands list)
    junc->demands.push_back(d);
}